

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_student.cpp
# Opt level: O2

void use_student(void)

{
  Student list [2];
  
  L14_1::Student::Student(list,3);
  L14_1::Student::Student(list + 1,3);
  set_student(list,3);
  set_student(list + 1,3);
  std::operator<<((ostream *)&std::cout,"\nResult:\n");
}

Assistant:

void use_student() {
    using namespace L14_1;

    const int num_student = 2;
    const int num_quiz = 3;

    Student list[num_student] = {
            Student(num_quiz),
            Student(num_quiz),
    };
    int i = 0;
    for (i = 0; i < num_student; i++) {
        set_student(list[i], num_quiz);
    }

    std::cout << "\nResult:\n";
    for (i = 0; i < num_student; i++) {
        std::cout << std::endl << list[i];
        std::cout << "average: " << list[i].get_average() << std::endl;
    }
    std::cout << "Done!\n";
}